

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32 field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  ulong uVar4;
  bool bVar5;
  Limit limit;
  int iVar6;
  uint32 first_byte_or_zero;
  int64 iVar7;
  ulong uVar8;
  uint first_byte_or_zero_00;
  int value;
  ulong unaff_R13;
  bool bVar9;
  
  pbVar3 = input->buffer_;
  if (pbVar3 < input->buffer_end_) {
    first_byte_or_zero_00 = (uint)*pbVar3;
    if (-1 < (char)*pbVar3) {
      input->buffer_ = pbVar3 + 1;
      bVar9 = true;
      goto LAB_002a3be2;
    }
  }
  else {
    first_byte_or_zero_00 = 0;
  }
  iVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero_00);
  first_byte_or_zero_00 = (uint)iVar7;
  bVar9 = -1 < iVar7;
LAB_002a3be2:
  if (bVar9) {
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero_00);
    do {
      iVar6 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar6 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar3 = input->buffer_;
      if (pbVar3 < input->buffer_end_) {
        bVar1 = *pbVar3;
        uVar8 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_002a3c23;
        input->buffer_ = pbVar3 + 1;
        bVar9 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_002a3c23:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar9 = -1 < (long)uVar8;
      }
      uVar4 = unaff_R13;
      if (bVar9) {
        uVar4 = uVar8;
      }
      unaff_R13 = uVar4 & 0xffffffff;
      if (!bVar9) {
        return false;
      }
      iVar6 = (int)uVar4;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar5 = (*is_valid)(iVar6), bVar5)) {
        if (values->current_size_ == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        iVar2 = values->current_size_;
        values->current_size_ = iVar2 + 1;
        *(int *)((long)values->arena_or_elements_ + (long)iVar2 * 4) = iVar6;
      }
      else {
        UnknownFieldSet::AddVarint(unknown_fields,field_number,(long)iVar6);
      }
    } while (bVar9);
  }
  return false;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32 field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}